

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TPZEqnArray<float>_*,_10>::~TPZManVector(TPZManVector<TPZEqnArray<float>_*,_10> *this)

{
  TPZEqnArray<float> **ppTVar1;
  
  (this->super_TPZVec<TPZEqnArray<float>_*>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_019c9618;
  if ((this->super_TPZVec<TPZEqnArray<float>_*>).fStore == this->fExtAlloc) {
    (this->super_TPZVec<TPZEqnArray<float>_*>).fStore = (TPZEqnArray<float> **)0x0;
  }
  (this->super_TPZVec<TPZEqnArray<float>_*>).fNAlloc = 0;
  (this->super_TPZVec<TPZEqnArray<float>_*>)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_019c9680;
  ppTVar1 = (this->super_TPZVec<TPZEqnArray<float>_*>).fStore;
  if (ppTVar1 == (TPZEqnArray<float> **)0x0) {
    return;
  }
  operator_delete__(ppTVar1);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}